

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall pbrt::ParsedScene::CoordSysTransform(ParsedScene *this,string *name,FileLoc loc)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  iterator iVar32;
  mapped_type *pmVar33;
  string local_38;
  
  iVar32 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
           ::find(&(this->namedCoordinateSystems)._M_t,name);
  if ((_Rb_tree_header *)iVar32._M_node ==
      &(this->namedCoordinateSystems)._M_t._M_impl.super__Rb_tree_header) {
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    detail::stringPrintfRecursive<std::__cxx11::string_const&>
              (&local_38,"Couldn\'t find named coordinate system \"%s\"",name);
    Warning(&loc,local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,
                      CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                               local_38.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    pmVar33 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
              ::operator[](&this->namedCoordinateSystems,name);
    uVar1 = *(undefined8 *)(pmVar33->t[0].m.m[0] + 2);
    uVar2 = *(undefined8 *)pmVar33->t[0].m.m[1];
    uVar3 = *(undefined8 *)(pmVar33->t[0].m.m[1] + 2);
    uVar4 = *(undefined8 *)pmVar33->t[0].m.m[2];
    uVar5 = *(undefined8 *)(pmVar33->t[0].m.m[2] + 2);
    uVar6 = *(undefined8 *)pmVar33->t[0].m.m[3];
    uVar7 = *(undefined8 *)(pmVar33->t[0].m.m[3] + 2);
    uVar8 = *(undefined8 *)pmVar33->t[0].mInv.m[0];
    uVar9 = *(undefined8 *)(pmVar33->t[0].mInv.m[0] + 2);
    uVar10 = *(undefined8 *)pmVar33->t[0].mInv.m[1];
    uVar11 = *(undefined8 *)(pmVar33->t[0].mInv.m[1] + 2);
    uVar12 = *(undefined8 *)pmVar33->t[0].mInv.m[2];
    uVar13 = *(undefined8 *)(pmVar33->t[0].mInv.m[2] + 2);
    uVar14 = *(undefined8 *)pmVar33->t[0].mInv.m[3];
    uVar15 = *(undefined8 *)(pmVar33->t[0].mInv.m[3] + 2);
    uVar16 = *(undefined8 *)pmVar33->t[1].m.m[0];
    uVar17 = *(undefined8 *)(pmVar33->t[1].m.m[0] + 2);
    uVar18 = *(undefined8 *)pmVar33->t[1].m.m[1];
    uVar19 = *(undefined8 *)(pmVar33->t[1].m.m[1] + 2);
    uVar20 = *(undefined8 *)pmVar33->t[1].m.m[2];
    uVar21 = *(undefined8 *)(pmVar33->t[1].m.m[2] + 2);
    uVar22 = *(undefined8 *)pmVar33->t[1].m.m[3];
    uVar23 = *(undefined8 *)(pmVar33->t[1].m.m[3] + 2);
    uVar24 = *(undefined8 *)pmVar33->t[1].mInv.m[0];
    uVar25 = *(undefined8 *)(pmVar33->t[1].mInv.m[0] + 2);
    uVar26 = *(undefined8 *)pmVar33->t[1].mInv.m[1];
    uVar27 = *(undefined8 *)(pmVar33->t[1].mInv.m[1] + 2);
    uVar28 = *(undefined8 *)pmVar33->t[1].mInv.m[2];
    uVar29 = *(undefined8 *)(pmVar33->t[1].mInv.m[2] + 2);
    uVar30 = *(undefined8 *)pmVar33->t[1].mInv.m[3];
    uVar31 = *(undefined8 *)(pmVar33->t[1].mInv.m[3] + 2);
    *(undefined8 *)(this->graphicsState).ctm.t[0].m.m[0] = *(undefined8 *)pmVar33->t[0].m.m[0];
    *(undefined8 *)((this->graphicsState).ctm.t[0].m.m[0] + 2) = uVar1;
    *(undefined8 *)(this->graphicsState).ctm.t[0].m.m[1] = uVar2;
    *(undefined8 *)((this->graphicsState).ctm.t[0].m.m[1] + 2) = uVar3;
    *(undefined8 *)(this->graphicsState).ctm.t[0].m.m[2] = uVar4;
    *(undefined8 *)((this->graphicsState).ctm.t[0].m.m[2] + 2) = uVar5;
    *(undefined8 *)(this->graphicsState).ctm.t[0].m.m[3] = uVar6;
    *(undefined8 *)((this->graphicsState).ctm.t[0].m.m[3] + 2) = uVar7;
    *(undefined8 *)(this->graphicsState).ctm.t[0].mInv.m[0] = uVar8;
    *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[0] + 2) = uVar9;
    *(undefined8 *)(this->graphicsState).ctm.t[0].mInv.m[1] = uVar10;
    *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[1] + 2) = uVar11;
    *(undefined8 *)(this->graphicsState).ctm.t[0].mInv.m[2] = uVar12;
    *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[2] + 2) = uVar13;
    *(undefined8 *)(this->graphicsState).ctm.t[0].mInv.m[3] = uVar14;
    *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[3] + 2) = uVar15;
    *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[0] = uVar16;
    *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[0] + 2) = uVar17;
    *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[1] = uVar18;
    *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[1] + 2) = uVar19;
    *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[2] = uVar20;
    *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[2] + 2) = uVar21;
    *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[3] = uVar22;
    *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[3] + 2) = uVar23;
    *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[0] = uVar24;
    *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[0] + 2) = uVar25;
    *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[1] = uVar26;
    *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[1] + 2) = uVar27;
    *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[2] = uVar28;
    *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[2] + 2) = uVar29;
    *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[3] = uVar30;
    *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[3] + 2) = uVar31;
  }
  return;
}

Assistant:

void ParsedScene::CoordSysTransform(const std::string &name, FileLoc loc) {
    if (namedCoordinateSystems.find(name) != namedCoordinateSystems.end())
        graphicsState.ctm = namedCoordinateSystems[name];
    else
        Warning(&loc, "Couldn't find named coordinate system \"%s\"", name);
}